

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlacon2.c
# Opt level: O0

int dlacon2_(int *n,double *v,double *x,int *isgn,double *est,int *kase,int *isave)

{
  int iVar1;
  integer iVar2;
  doublereal dVar3;
  double dVar4;
  double dVar5;
  double local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  double temp;
  int i;
  double estold;
  double altsgn;
  int jlast;
  double one;
  double zero;
  int *piStack_40;
  int c__1;
  int *kase_local;
  double *est_local;
  int *isgn_local;
  double *x_local;
  double *v_local;
  int *n_local;
  
  zero._4_4_ = 1;
  if (*kase == 0) {
    for (temp._4_4_ = 0; temp._4_4_ < *n; temp._4_4_ = temp._4_4_ + 1) {
      x[temp._4_4_] = 1.0 / (double)*n;
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  piStack_40 = kase;
  kase_local = (int *)est;
  est_local = (double *)isgn;
  isgn_local = (int *)x;
  x_local = v;
  v_local = (double *)n;
  switch(*isave) {
  case 1:
  default:
    if (*n == 1) {
      *v = *x;
      *est = ABS(*v);
LAB_00119373:
      *piStack_40 = 0;
    }
    else {
      dVar3 = dasum_(n,x,(integer *)((long)&zero + 4));
      *(doublereal *)kase_local = dVar3;
      for (temp._4_4_ = 0; temp._4_4_ < *(int *)v_local; temp._4_4_ = temp._4_4_ + 1) {
        if (*(double *)(isgn_local + (long)temp._4_4_ * 2) < 0.0) {
          local_90 = 0xbff0000000000000;
        }
        else {
          local_90 = 0x3ff0000000000000;
        }
        *(undefined8 *)(isgn_local + (long)temp._4_4_ * 2) = local_90;
        if (*(double *)(isgn_local + (long)temp._4_4_ * 2) < 0.0) {
          local_98 = floor(0.5 - *(double *)(isgn_local + (long)temp._4_4_ * 2));
          local_98 = -local_98;
        }
        else {
          local_98 = floor(*(double *)(isgn_local + (long)temp._4_4_ * 2) + 0.5);
        }
        *(int *)((long)est_local + (long)temp._4_4_ * 4) = (int)local_98;
      }
      *piStack_40 = 2;
      *isave = 2;
    }
    break;
  case 2:
    iVar2 = idamax_(n,x,(integer *)((long)&zero + 4));
    isave[1] = iVar2;
    isave[1] = isave[1] + -1;
    isave[2] = 2;
    goto LAB_00118dff;
  case 3:
    dcopy_(n,x,(integer *)((long)&zero + 4),v,(integer *)((long)&zero + 4));
    dVar4 = *(double *)kase_local;
    dVar3 = dasum_((integer *)v_local,x_local,(integer *)((long)&zero + 4));
    *(doublereal *)kase_local = dVar3;
    for (temp._4_4_ = 0; temp._4_4_ < *(int *)v_local; temp._4_4_ = temp._4_4_ + 1) {
      if (*(double *)(isgn_local + (long)temp._4_4_ * 2) < 0.0) {
        local_a0 = -1.0;
      }
      else {
        local_a0 = 1.0;
      }
      if (local_a0 < 0.0) {
        if (*(double *)(isgn_local + (long)temp._4_4_ * 2) < 0.0) {
          local_b8 = -1.0;
        }
        else {
          local_b8 = 1.0;
        }
        local_b0 = floor(0.5 - local_b8);
        local_b0 = -local_b0;
      }
      else {
        if (*(double *)(isgn_local + (long)temp._4_4_ * 2) < 0.0) {
          local_a8 = -1.0;
        }
        else {
          local_a8 = 1.0;
        }
        local_b0 = floor(local_a8 + 0.5);
      }
      dVar5 = (double)*(int *)((long)est_local + (long)temp._4_4_ * 4);
      if ((local_b0 != dVar5) || (NAN(local_b0) || NAN(dVar5))) {
        if (dVar4 < *(double *)kase_local) {
          for (temp._4_4_ = 0; temp._4_4_ < *(int *)v_local; temp._4_4_ = temp._4_4_ + 1) {
            if (*(double *)(isgn_local + (long)temp._4_4_ * 2) < 0.0) {
              local_c0 = 0xbff0000000000000;
            }
            else {
              local_c0 = 0x3ff0000000000000;
            }
            *(undefined8 *)(isgn_local + (long)temp._4_4_ * 2) = local_c0;
            if (*(double *)(isgn_local + (long)temp._4_4_ * 2) < 0.0) {
              local_c8 = floor(0.5 - *(double *)(isgn_local + (long)temp._4_4_ * 2));
              local_c8 = -local_c8;
            }
            else {
              local_c8 = floor(*(double *)(isgn_local + (long)temp._4_4_ * 2) + 0.5);
            }
            *(int *)((long)est_local + (long)temp._4_4_ * 4) = (int)local_c8;
          }
          *piStack_40 = 2;
          *isave = 4;
          return 0;
        }
        break;
      }
    }
LAB_00119262:
    estold = 1.0;
    for (temp._4_4_ = 1; temp._4_4_ <= *(int *)v_local; temp._4_4_ = temp._4_4_ + 1) {
      *(double *)(isgn_local + (long)(temp._4_4_ + -1) * 2) =
           estold * ((double)(temp._4_4_ + -1) / (double)(*(int *)v_local + -1) + 1.0);
      estold = -estold;
    }
    *piStack_40 = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar1 = isave[1];
    iVar2 = idamax_(n,x,(integer *)((long)&zero + 4));
    isave[1] = iVar2;
    isave[1] = isave[1] + -1;
    if (((*(double *)(isgn_local + (long)iVar1 * 2) ==
          ABS(*(double *)(isgn_local + (long)isave[1] * 2))) &&
        (!NAN(*(double *)(isgn_local + (long)iVar1 * 2)) &&
         !NAN(ABS(*(double *)(isgn_local + (long)isave[1] * 2))))) || (4 < isave[2]))
    goto LAB_00119262;
    isave[2] = isave[2] + 1;
LAB_00118dff:
    for (temp._4_4_ = 0; temp._4_4_ < *(int *)v_local; temp._4_4_ = temp._4_4_ + 1) {
      (isgn_local + (long)temp._4_4_ * 2)[0] = 0;
      (isgn_local + (long)temp._4_4_ * 2)[1] = 0;
    }
    iVar1 = isave[1];
    (isgn_local + (long)iVar1 * 2)[0] = 0;
    (isgn_local + (long)iVar1 * 2)[1] = 0x3ff00000;
    *piStack_40 = 1;
    *isave = 3;
    break;
  case 5:
    dVar3 = dasum_(n,x,(integer *)((long)&zero + 4));
    dVar4 = (dVar3 / (double)(*(int *)v_local * 3)) * 2.0;
    if (*(double *)kase_local <= dVar4 && dVar4 != *(double *)kase_local) {
      dcopy_((integer *)v_local,(doublereal *)isgn_local,(integer *)((long)&zero + 4),x_local,
             (integer *)((long)&zero + 4));
      *(double *)kase_local = dVar4;
    }
    goto LAB_00119373;
  }
  return 0;
}

Assistant:

int
dlacon2_(int *n, double *v, double *x, int *isgn, double *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    double      zero = 0.0;
    double      one = 1.0;
    
    /* Local variables */
    int jlast;
    double altsgn, estold;
    int i;
    double temp;
#ifdef _CRAY
    extern int ISAMAX(int *, double *, int *);
    extern double SASUM(int *, double *, int *);
    extern int SCOPY(int *, double *, int *, double *, int *);
#else
    extern int idamax_(int *, double *, int *);
    extern double dasum_(int *, double *, int *);
    extern void dcopy_(int *, double *, int *, double *, int *);
#endif
#define d_sign(a, b) (b >= 0 ? fabs(a) : -fabs(a))    /* Copy sign */
#define i_dnnt(a) \
	( a>=0 ? floor(a+.5) : -floor(.5-a) ) /* Round to nearest integer */

    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i] = 1. / (double) (*n);
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = fabs(v[0]);
	/*        ... QUIT */
	goto L150;
    }
#ifdef _CRAY
    *est = SASUM(n, x, &c__1);
#else
    *est = dasum_(n, x, &c__1);
#endif

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);  /* j */
#else
    isave[1] = idamax_(n, &x[0], &c__1);  /* j */
#endif
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    SCOPY(n, x, &c__1, v, &c__1);
#else
    dcopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
#ifdef _CRAY
    *est = SASUM(n, v, &c__1);
#else
    *est = dasum_(n, v, &c__1);
#endif

    for (i = 0; i < *n; ++i)
	if (i_dnnt(d_sign(one, x[i])) != isgn[i])
	    goto L90;

    /*     REPEATED SIGN VECTOR DETECTED, HENCE ALGORITHM HAS CONVERGED. */
    goto L120;

L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);/* j */
#else
    isave[1] = idamax_(n, &x[0], &c__1);  /* j */
#endif
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast] != fabs(x[isave[1]]) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1] = altsgn * ((double)(i - 1) / (double)(*n - 1) + 1.);
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
#ifdef _CRAY
    temp = SASUM(n, x, &c__1) / (double)(*n * 3) * 2.;
#else
    temp = dasum_(n, x, &c__1) / (double)(*n * 3) * 2.;
#endif
    if (temp > *est) {
#ifdef _CRAY
	SCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	dcopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}